

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall
t_netstd_generator::generate_deserialize_field
          (t_netstd_generator *this,ostream *out,t_field *tfield,string *prefix,bool is_propertyless
          )

{
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *__rhs;
  ostream *poVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  string local_180;
  undefined1 local_159;
  string local_158;
  t_base local_134;
  undefined1 local_130 [4];
  t_base tbase;
  string local_110;
  string local_f0;
  string local_d0;
  byte local_aa;
  allocator local_a9;
  string local_a8;
  undefined1 local_88 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  t_struct *local_38;
  t_type *type;
  string *psStack_28;
  bool is_propertyless_local;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_netstd_generator *this_local;
  
  type._7_1_ = is_propertyless;
  psStack_28 = prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  local_38 = (t_struct *)t_field::get_type(tfield);
  local_38 = (t_struct *)resolve_typedef((t_type *)local_38);
  uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    local_aa = 0;
    if ((type._7_1_ & 1) == 0) {
      prop_name_abi_cxx11_(&local_a8,this,(t_field *)prefix_local,false);
    }
    else {
      std::allocator<char>::allocator();
      local_aa = 1;
      std::__cxx11::string::string((string *)&local_a8,"",&local_a9);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   prefix,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if ((local_aa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_38;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          uVar6 = std::__cxx11::string::c_str();
          type_name_abi_cxx11_(&local_180,this,&local_38->super_t_type,true);
          uVar7 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",uVar6,uVar7);
          std::__cxx11::string::~string((string *)&local_180);
        }
        else {
          ptVar2 = tfield_local;
          t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
          poVar5 = std::operator<<((ostream *)ptVar2,(string *)&local_110);
          poVar5 = std::operator<<(poVar5,(string *)local_88);
          std::operator<<(poVar5," = ");
          std::__cxx11::string::~string((string *)&local_110);
          uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])();
          if ((uVar3 & 1) != 0) {
            poVar5 = std::operator<<((ostream *)tfield_local,"(");
            type_name_abi_cxx11_((string *)local_130,this,&local_38->super_t_type,true);
            poVar5 = std::operator<<(poVar5,(string *)local_130);
            std::operator<<(poVar5,")");
            std::__cxx11::string::~string((string *)local_130);
          }
          std::operator<<((ostream *)tfield_local,"await iprot.");
          uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar3 & 1) != 0) {
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadI32Async(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
            }
          }
          else {
            local_134 = t_base_type::get_base((t_base_type *)local_38);
            switch(local_134) {
            case TYPE_VOID:
              pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar4,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_88);
              __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              uVar3 = (*(local_38->super_t_type).super_t_doc._vptr_t_doc[7])();
              if ((uVar3 & 1) == 0) {
                poVar5 = std::operator<<((ostream *)tfield_local,"ReadStringAsync(");
                poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
                std::operator<<(poVar5,");");
              }
              else {
                poVar5 = std::operator<<((ostream *)tfield_local,"ReadBinaryAsync(");
                poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
                std::operator<<(poVar5,");");
              }
              break;
            case TYPE_BOOL:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadBoolAsync(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            case TYPE_I8:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadByteAsync(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            case TYPE_I16:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadI16Async(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            case TYPE_I32:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadI32Async(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            case TYPE_I64:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadI64Async(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            case TYPE_DOUBLE:
              poVar5 = std::operator<<((ostream *)tfield_local,"ReadDoubleAsync(");
              poVar5 = std::operator<<(poVar5,(string *)&CANCELLATION_TOKEN_NAME_abi_cxx11_);
              std::operator<<(poVar5,");");
              break;
            default:
              local_159 = 1;
              auVar8 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_158,(t_base_type *)(ulong)local_134,auVar8._8_4_);
              std::operator+(auVar8._0_8_,"compiler error: no C# name for base type ",&local_158);
              local_159 = 0;
              __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                         );
            }
          }
          std::operator<<((ostream *)tfield_local,(string *)&::endl_abi_cxx11_);
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_f0,(string *)local_88);
        generate_deserialize_container(this,(ostream *)ptVar2,&ptVar1->super_t_type,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_38;
      std::__cxx11::string::string((string *)&local_d0,(string *)local_88);
      generate_deserialize_struct(this,(ostream *)ptVar2,ptVar1,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    std::__cxx11::string::~string((string *)local_88);
    return;
  }
  name.field_2._M_local_buf[0xb] = '\x01';
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_58,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
  __rhs = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(pbVar4,&local_58,__rhs);
  name.field_2._M_local_buf[0xb] = '\0';
  __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_netstd_generator::generate_deserialize_field(ostream& out, t_field* tfield, string prefix, bool is_propertyless)
{
    t_type* type = tfield->get_type();
    type = resolve_typedef( type);

    if (type->is_void())
    {
        throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
    }

    string name = prefix + (is_propertyless ? "" : prop_name(tfield));

    if (type->is_struct() || type->is_xception())
    {
        generate_deserialize_struct(out, static_cast<t_struct*>(type), name);
    }
    else if (type->is_container())
    {
        generate_deserialize_container(out, type, name);
    }
    else if (type->is_base_type() || type->is_enum())
    {
        out << indent() << name << " = ";

        if (type->is_enum())
        {
            out << "(" << type_name(type) << ")";
        }

        out << "await iprot.";

        if (type->is_base_type())
        {
            t_base_type::t_base tbase = static_cast<t_base_type*>(type)->get_base();
            switch (tbase)
            {
            case t_base_type::TYPE_VOID:
                throw "compiler error: cannot serialize void field in a struct: " + name;
                break;
            case t_base_type::TYPE_STRING:
                if (type->is_binary())
                {
                    out << "ReadBinaryAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                else
                {
                    out << "ReadStringAsync(" << CANCELLATION_TOKEN_NAME << ");";
                }
                break;
            case t_base_type::TYPE_BOOL:
                out << "ReadBoolAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I8:
                out << "ReadByteAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I16:
                out << "ReadI16Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I32:
                out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_I64:
                out << "ReadI64Async(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            case t_base_type::TYPE_DOUBLE:
                out << "ReadDoubleAsync(" << CANCELLATION_TOKEN_NAME << ");";
                break;
            default:
                throw "compiler error: no C# name for base type " + t_base_type::t_base_name(tbase);
            }
        }
        else if (type->is_enum())
        {
            out << "ReadI32Async(" << CANCELLATION_TOKEN_NAME << ");";
        }
        out << endl;
    }
    else
    {
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n", tfield->get_name().c_str(), type_name(type).c_str());
    }
}